

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void rtDataHandler(vector<SRI::RTData<float>,_std::allocator<SRI::RTData<float>_>_> *rtData)

{
  ostream *poVar1;
  size_type sVar2;
  reference this;
  float *pfVar3;
  int local_18;
  int local_14;
  int j;
  int i_1;
  vector<SRI::RTData<float>,_std::allocator<SRI::RTData<float>_>_> *rtData_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rtDataHandler::i);
  std::operator<<(poVar1,"] RT Data is ->  ");
  local_14 = 0;
  while( true ) {
    sVar2 = std::vector<SRI::RTData<float>,_std::allocator<SRI::RTData<float>_>_>::size(rtData);
    if (sVar2 <= (ulong)(long)local_14) break;
    for (local_18 = 0; local_18 < 6; local_18 = local_18 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Ch ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
      poVar1 = std::operator<<(poVar1,": ");
      this = std::vector<SRI::RTData<float>,_std::allocator<SRI::RTData<float>_>_>::operator[]
                       (rtData,(long)local_14);
      pfVar3 = SRI::RTData<float>::operator[](this,local_18);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pfVar3);
      std::operator<<(poVar1,"\t");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_14 = local_14 + 1;
  }
  rtDataHandler::i = rtDataHandler::i + 1;
  return;
}

Assistant:

void rtDataHandler(std::vector<RTData<float>>& rtData) {
    static int i = 0;
    std::cout << "[" << i << "] RT Data is ->  ";
    for(int i = 0; i < rtData.size(); i++) {
        for(int j = 0; j < 6; j++) {
            std::cout << "Ch " << j << ": " << rtData[i][j] << "\t";
        }
        std::cout << std::endl;
    }
    i++;
}